

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::~optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test
          (optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  ~optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2;
  o2 = o1;
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}